

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

bool chrono::utils::AddTriangleMeshConvexDecomposition
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,float skin_thickness,
               bool use_original_asset,shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int *p_Var5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ChVisualModel *this;
  undefined8 uVar12;
  bool bVar13;
  uint uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _func_int **pp_Var16;
  ostream *this_00;
  ChTriangleMeshShape *this_01;
  long lVar17;
  element_type **size;
  size_t size_00;
  uint hullIndex;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape_1;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> convexhull;
  ChConvexDecompositionHACDv2 decomposition;
  stringstream ss;
  ChTriangleMeshShape *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3f0;
  ChBody *local_3e8;
  uint local_3dc;
  undefined1 local_3d8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3b0;
  pointer pCStack_3a8;
  pointer local_3a0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_398;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_378;
  shared_ptr<chrono::ChVisualModel> local_368;
  shared_ptr<chrono::ChVisualShape> local_358;
  shared_ptr<chrono::ChVisualMaterial> local_348;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_338;
  shared_ptr<chrono::ChVisualShape> local_328;
  shared_ptr<chrono::ChVisualMaterial> local_318;
  element_type *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_300;
  _Alloc_hider local_2f8;
  _func_int **local_2f0;
  undefined **local_2e8 [2];
  shared_ptr<chrono::ChMaterialSurface> *local_2d8;
  ChVisualModel *local_2d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  ChFrame<double> local_2c0;
  ChConvexDecompositionHACDv2 local_238;
  undefined1 local_1b8 [16];
  double dStack_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  undefined1 local_178 [328];
  
  local_3e8 = body;
  local_3d8._16_8_ = name;
  local_2d8 = material;
  ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
  uVar12 = local_1b8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
  }
  if ((_func_int **)uVar12 == (_func_int **)0x0) {
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var15->_M_use_count = 1;
    p_Var15->_M_weak_count = 1;
    local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var15 + 1);
    p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
    p_Var15[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var15[1]._M_use_count = 0;
    p_Var15[1]._M_weak_count = 0;
    p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var15[2]._M_use_count = 0;
    p_Var15[2]._M_weak_count = 0;
    p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var15[2]._M_use_count = 0;
    p_Var15[2]._M_weak_count = 0;
    p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var15[3]._M_use_count = 0;
    p_Var15[3]._M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var15->_M_use_count = 2;
    }
    local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var15;
    ChPhysicsItem::AddVisualModel(&local_3e8->super_ChPhysicsItem,&local_368);
    if (local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
  }
  bVar18 = false;
  local_3d8._24_8_ = pos;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_3d8,obj_filename,true,false);
  if ((_func_int **)local_3d8._0_8_ != (_func_int **)0x0) {
    pp_Var16 = (((ChTriangleMesh *)(local_3d8._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry;
    lVar17 = (long)(((ChTriangleMesh *)(local_3d8._0_8_ + 0x10))->super_ChGeometry)._vptr_ChGeometry
             - (long)pp_Var16;
    if (lVar17 != 0) {
      auVar19 = ZEXT816(0xbff0000000000000);
      auVar20 = ZEXT816(0x4000000000000000);
      lVar17 = (lVar17 >> 3) * -0x5555555555555555;
      lVar17 = lVar17 + (ulong)(lVar17 == 0);
      pp_Var16 = pp_Var16 + 2;
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[2];
        dVar3 = rot->m_data[1];
        dVar4 = rot->m_data[3];
        p_Var5 = pp_Var16[-1];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = pp_Var16[-2];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *pp_Var16;
        dVar9 = dVar1 * dVar1;
        dVar10 = dVar3 * dVar2 - dVar4 * dVar1;
        dVar8 = dVar3 * dVar2 + dVar4 * dVar1;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar9 + dVar2 * dVar2;
        auVar26 = vfmadd213sd_fma(auVar28,auVar20,auVar19);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar9 + dVar3 * dVar3;
        auVar22 = vfmadd213sd_fma(auVar25,auVar20,auVar19);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = (double)p_Var5 * (dVar10 + dVar10);
        auVar22 = vfmadd231sd_fma(auVar30,auVar31,auVar22);
        dVar10 = dVar1 * dVar2 + dVar4 * dVar3;
        dVar11 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar8 + dVar8;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (double)p_Var5 * auVar26._0_8_;
        auVar21 = vfmadd231sd_fma(auVar29,auVar31,auVar21);
        dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar2 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar10 + dVar10;
        auVar26 = vfmadd213sd_fma(auVar26,auVar32,auVar22);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar8 + dVar8;
        auVar22 = vfmadd213sd_fma(auVar22,auVar32,auVar21);
        dVar1 = ((double *)local_3d8._24_8_)[1];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar11 + dVar11;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (double)p_Var5 * (dVar2 + dVar2);
        auVar23 = vfmadd231sd_fma(auVar27,auVar31,auVar23);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar4 * dVar4 + dVar9;
        auVar21 = vfmadd213sd_fma(auVar24,auVar20,auVar19);
        auVar21 = vfmadd213sd_fma(auVar21,auVar32,auVar23);
        dVar2 = ((double *)local_3d8._24_8_)[2];
        pp_Var16[-2] = (_func_int *)(auVar26._0_8_ + *(double *)local_3d8._24_8_);
        pp_Var16[-1] = (_func_int *)(auVar22._0_8_ + dVar1);
        *pp_Var16 = (_func_int *)(auVar21._0_8_ + dVar2);
        pp_Var16 = pp_Var16 + 3;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&local_238);
    collision::ChConvexDecompositionHACDv2::Reset(&local_238);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&local_238,(ChTriangleMesh *)local_3d8._0_8_);
    size = (element_type **)0x200;
    collision::ChConvexDecompositionHACDv2::SetParameters(&local_238,0x200,0x100,0x40,0.2,0.0,1e-09)
    ;
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&local_238);
    uVar14 = collision::ChConvexDecompositionHACDv2::GetHullCount(&local_238);
    local_398.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_398.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((int)uVar14 < 1) {
      bVar18 = true;
    }
    else {
      bVar18 = false;
      hullIndex = 0;
      local_2e8[0] = &PTR___Sp_counted_ptr_inplace_00b3ebb8;
      local_2f0 = (_func_int **)&PTR__ChTriangleMeshConnected_00b3eaa8;
      local_2f8._M_p = (pointer)&PTR__ChFrame_00b03780;
      local_3dc = uVar14;
      local_2e8[1] = (undefined **)rot;
      do {
        collision::ChConvexDecompositionHACDv2::GetConvexHullResult(&local_238,hullIndex,&local_398)
        ;
        peVar6 = (local_3e8->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var15 = (local_3e8->collision_model).
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        local_308 = (local_2d8->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        p_Stack_300 = (local_2d8->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
        p_Var7 = (local_2d8->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        ChMatrix33<double>::ChMatrix33
                  ((ChMatrix33<double> *)local_1b8,(ChQuaternion<double> *)local_2e8[1]);
        size = &local_308;
        (*peVar6->_vptr_ChCollisionModel[0xf])
                  (peVar6,size,&local_398,local_3d8._24_8_,(stringstream *)local_1b8);
        if (p_Stack_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_300);
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        if (!use_original_asset) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          this_00 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&dStack_1a8,((_Alloc_hider *)local_3d8._16_8_)->_M_p,
                               *(size_type *)(local_3d8._16_8_ + 8));
          std::__ostream_insert<char,std::char_traits<char>>(this_00,"_",1);
          std::ostream::operator<<(this_00,hullIndex);
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
          p_Var15->_M_use_count = 1;
          p_Var15->_M_weak_count = 1;
          p_Var15->_vptr__Sp_counted_base = (_func_int **)local_2e8[0];
          p_Var15[1]._vptr__Sp_counted_base = local_2f0;
          p_Var15[9]._M_use_count = 0;
          p_Var15[9]._M_weak_count = 0;
          p_Var15[10]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[10]._M_use_count = 0;
          p_Var15[10]._M_weak_count = 0;
          p_Var15[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[0xb]._M_use_count = 0;
          p_Var15[0xb]._M_weak_count = 0;
          p_Var15[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[0xc]._M_use_count = 0;
          p_Var15[0xc]._M_weak_count = 0;
          p_Var15[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[1]._M_use_count = 0;
          p_Var15[1]._M_weak_count = 0;
          p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[2]._M_use_count = 0;
          p_Var15[2]._M_weak_count = 0;
          p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[3]._M_use_count = 0;
          p_Var15[3]._M_weak_count = 0;
          p_Var15[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[4]._M_use_count = 0;
          p_Var15[4]._M_weak_count = 0;
          p_Var15[5]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[5]._M_use_count = 0;
          p_Var15[5]._M_weak_count = 0;
          p_Var15[6]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[6]._M_use_count = 0;
          p_Var15[6]._M_weak_count = 0;
          p_Var15[7]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[7]._M_use_count = 0;
          p_Var15[7]._M_weak_count = 0;
          p_Var15[8]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[8]._M_use_count = 0;
          p_Var15[8]._M_weak_count = 0;
          p_Var15[9]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[0xb]._M_use_count = 0;
          p_Var15[0xb]._M_weak_count = 0;
          p_Var15[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[0xc]._M_use_count = 0;
          p_Var15[0xc]._M_weak_count = 0;
          p_Var15[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[0xd]._M_use_count = 0;
          p_Var15[0xd]._M_weak_count = 0;
          p_Var15[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[0xe]._M_use_count = 0;
          p_Var15[0xe]._M_weak_count = 0;
          p_Var15[0xf]._vptr__Sp_counted_base = (_func_int **)(p_Var15 + 0x10);
          p_Var15[0xf]._M_use_count = 0;
          p_Var15[0xf]._M_weak_count = 0;
          *(undefined1 *)&p_Var15[0x10]._vptr__Sp_counted_base = 0;
          size_00 = (size_t)hullIndex;
          bVar13 = collision::ChConvexDecompositionHACDv2::GetConvexHullResult
                             (&local_238,hullIndex,(ChTriangleMesh *)(p_Var15 + 1));
          if (!bVar13) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
            goto LAB_0091124d;
          }
          local_3f8 = (ChTriangleMeshShape *)
                      ChVisualShape::operator_new((ChVisualShape *)0x98,size_00);
          ChTriangleMeshShape::ChTriangleMeshShape(local_3f8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChTriangleMeshShape*>(&_Stack_3f0,local_3f8);
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
          local_378.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(p_Var15 + 1);
          local_378.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var15;
          ChTriangleMeshShape::SetMesh(local_3f8,&local_378,true);
          if (local_378.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_378.
                       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&local_3f8->name);
          if (local_2c0._vptr_ChFrame != (_func_int **)(local_2c0.coord.pos.m_data + 1)) {
            operator_delete(local_2c0._vptr_ChFrame,(long)local_2c0.coord.pos.m_data[1] + 1);
          }
          local_318.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (vis_material->
                 super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_318.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
          p_Var7 = (vis_material->
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          ChVisualShape::AddMaterial((ChVisualShape *)local_3f8,&local_318);
          if (local_318.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_318.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          ChPhysicsItem::GetVisualModel(&local_3e8->super_ChPhysicsItem);
          this = local_2d0;
          local_328.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_3f0._M_pi;
          if (_Stack_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_3f0._M_pi)->_M_use_count = (_Stack_3f0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_3f0._M_pi)->_M_use_count = (_Stack_3f0._M_pi)->_M_use_count + 1;
            }
          }
          local_3d8._32_8_ = (ChTriangleMeshShape *)0x3ff0000000000000;
          local_3a0 = (pointer)0x0;
          _Stack_3b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pCStack_3a8 = (pointer)0x0;
          local_2c0._vptr_ChFrame = (_func_int **)local_2f8._M_p;
          local_2c0.coord.pos.m_data[2] = 0.0;
          local_2c0.coord.pos.m_data[0] = 0.0;
          local_2c0.coord.pos.m_data[1] = 0.0;
          local_2c0.coord.rot.m_data[0] = 1.0;
          local_2c0.coord.rot.m_data[3] = 0.0;
          local_2c0.coord.rot.m_data[1] = 0.0;
          local_2c0.coord.rot.m_data[2] = 0.0;
          local_328.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_3f8;
          ChMatrix33<double>::ChMatrix33
                    (&local_2c0.Amatrix,(ChQuaternion<double> *)(local_3d8 + 0x20));
          ChVisualModel::AddShape(this,&local_328,&local_2c0);
          if (local_328.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_328.
                       super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_2c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8);
          }
          if (_Stack_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3f0._M_pi);
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
          size = (element_type **)&std::__cxx11::stringstream::VTT;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
        }
        hullIndex = hullIndex + 1;
        bVar18 = (int)local_3dc <= (int)hullIndex;
      } while (hullIndex != local_3dc);
    }
    if (use_original_asset) {
      this_01 = (ChTriangleMeshShape *)
                ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
      ChTriangleMeshShape::ChTriangleMeshShape(this_01);
      local_3d8._32_8_ = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
                (&_Stack_3b0,this_01);
      local_338.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_3d8._0_8_;
      local_338.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_3d8._8_8_ + 8) = *(_Atomic_word *)(local_3d8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_3d8._8_8_ + 8) = *(_Atomic_word *)(local_3d8._8_8_ + 8) + 1;
        }
      }
      ChTriangleMeshShape::SetMesh((ChTriangleMeshShape *)local_3d8._32_8_,&local_338,true);
      if (local_338.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::__cxx11::string::_M_assign((string *)(local_3d8._32_8_ + 0x40));
      local_348.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_348.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      p_Var15 = (vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      ChVisualShape::AddMaterial((ChVisualShape *)local_3d8._32_8_,&local_348);
      if (local_348.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_348.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ChPhysicsItem::GetVisualModel(&local_3e8->super_ChPhysicsItem);
      local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3d8._32_8_;
      local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_3b0._M_pi;
      if (_Stack_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_3b0._M_pi)->_M_use_count = (_Stack_3b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_3b0._M_pi)->_M_use_count = (_Stack_3b0._M_pi)->_M_use_count + 1;
        }
      }
      local_2c0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
      local_2c0.coord.pos.m_data[0] = 0.0;
      local_2c0.coord.pos.m_data[1] = 0.0;
      local_2c0.coord.pos.m_data[2] = 0.0;
      local_1b8._0_8_ = &PTR__ChFrame_00b03780;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      dStack_1a8 = 0.0;
      local_1a0 = 0.0;
      local_198 = 1.0;
      local_190 = 0.0;
      dStack_188 = 0.0;
      local_180 = 0.0;
      ChMatrix33<double>::ChMatrix33
                ((ChMatrix33<double> *)local_178,(ChQuaternion<double> *)&local_2c0);
      ChVisualModel::AddShape((ChVisualModel *)local_3f8,&local_358,(ChFrame<double> *)local_1b8);
      if (local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Stack_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3f0._M_pi);
      }
      if (_Stack_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3b0._M_pi);
      }
    }
LAB_0091124d:
    if (local_398.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_398.
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_398.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_398.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&local_238);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_);
  }
  return bVar18;
}

Assistant:

bool AddTriangleMeshConvexDecomposition(ChBody* body,
                                        std::shared_ptr<ChMaterialSurface> material,
                                        const std::string& obj_filename,
                                        const std::string& name,
                                        const ChVector<>& pos,
                                        const ChQuaternion<>& rot,
                                        float skin_thickness,
                                        bool use_original_asset,
                                        std::shared_ptr<ChVisualMaterial> vis_material) {
    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 decomposition;

    int hacd_maxhullcount = 512;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    float hacd_concavity = 0.2f;
    float hacd_smallclusterthreshold = 0.0f;
    float hacd_fusetolerance = 1e-9f;

    decomposition.Reset();
    decomposition.AddTriangleMesh(*trimesh);

    decomposition.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes, hacd_concavity,
                                hacd_smallclusterthreshold, hacd_fusetolerance);
    decomposition.ComputeConvexDecomposition();

    int hull_count = decomposition.GetHullCount();
    std::vector<ChVector<double>> convexhull;
    for (int c = 0; c < hull_count; c++) {
        decomposition.GetConvexHullResult(c, convexhull);

        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        if (!use_original_asset) {
            std::stringstream ss;
            ss << name << "_" << c;
            auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
            if (!decomposition.GetConvexHullResult(c, *trimesh_convex))
                return false;

            auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
            trimesh_shape->SetMesh(trimesh_convex);
            trimesh_shape->SetName(ss.str());
            trimesh_shape->AddMaterial(vis_material);
            body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
        }
    }

    if (use_original_asset) {
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}